

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::MhsReader::MhsReader(MhsReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  int *value;
  ADIOS *this_00;
  IO *this_01;
  int __val;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  Comm local_160;
  Engine *local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  int *local_108;
  string local_100;
  string local_e0;
  Params params;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_e0,"MhsReader",(allocator *)&local_150);
  helper::Comm::Comm(&local_160,comm);
  Engine::Engine(&this->super_Engine,&local_e0,io,name,mode,&local_160);
  helper::Comm::~Comm(&local_160);
  std::__cxx11::string::~string((string *)&local_e0);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsReader_008260f0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_150,"Tiers",(allocator *)&params);
  value = &this->m_Tiers;
  helper::GetParameter<int>(&io->m_Parameters,&local_150.first,value);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::to_string(&local_100,*value);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_150,(char (*) [6])"Tiers",&local_100);
  __l._M_len = 1;
  __l._M_array = &local_150;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&params,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_90,(allocator_type *)&local_158);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_150);
  std::__cxx11::string::~string((string *)&local_100);
  std::
  make_shared<adios2::core::compress::CompressSirius,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_150);
  std::__shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_SiriusCompressor).
              super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2> *)
              &local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_150.first._M_string_length);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_150);
  IO::SetEngine(io,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_150.first._M_dataplus._M_p = (pointer)io;
  std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::emplace_back<adios2::core::IO*>
            ((vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_SubIOs,
             (IO **)&local_150);
  local_110 = &(this->super_Engine).m_Name;
  std::operator+(&local_150.first,local_110,".tier0");
  local_108 = value;
  local_100._M_dataplus._M_p = (pointer)IO::Open(io,&local_150.first,Read);
  std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
  emplace_back<adios2::core::Engine*>
            ((vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
             &this->m_SubEngines,(Engine **)&local_100);
  std::__cxx11::string::~string((string *)&local_150);
  for (__val = 1; __val < *local_108; __val = __val + 1) {
    this_00 = io->m_ADIOS;
    std::__cxx11::to_string(&local_150.first,__val);
    std::operator+(&local_70,"SubIO",&local_150.first);
    local_100._M_dataplus._M_p = (pointer)ADIOS::DeclareIO(this_00,&local_70,Auto);
    std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
    emplace_back<adios2::core::IO*>
              ((vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_SubIOs,
               (IO **)&local_100);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    this_01 = (this->m_SubIOs).
              super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
    std::operator+(&local_100,local_110,".tier");
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_150.first,&local_100,&local_90);
    local_158 = IO::Open(this_01,&local_150.first,Read);
    std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
    emplace_back<adios2::core::Engine*>
              ((vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
               &this->m_SubEngines,&local_158);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_100);
  }
  (this->super_Engine).m_IsOpen = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  return;
}

Assistant:

MhsReader::MhsReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("MhsReader", io, name, mode, std::move(comm))
{
    helper::GetParameter(io.m_Parameters, "Tiers", m_Tiers);
    Params params = {{"Tiers", std::to_string(m_Tiers)}};
    m_SiriusCompressor = std::make_shared<compress::CompressSirius>(params);
    io.SetEngine("");
    m_SubIOs.emplace_back(&io);
    m_SubEngines.emplace_back(&io.Open(m_Name + ".tier0", adios2::Mode::Read));

    for (int i = 1; i < m_Tiers; ++i)
    {
        m_SubIOs.emplace_back(&io.m_ADIOS.DeclareIO("SubIO" + std::to_string(i)));
        m_SubEngines.emplace_back(
            &m_SubIOs.back()->Open(m_Name + ".tier" + std::to_string(i), adios2::Mode::Read));
    }
    m_IsOpen = true;
}